

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

reference<mpt::layout::graph::world> * __thiscall
mpt::reference<mpt::layout::graph::world>::operator=
          (reference<mpt::layout::graph::world> *this,reference<mpt::layout::graph::world> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  world *pwVar2;
  world *pwVar3;
  
  pwVar3 = ref->_ref;
  pwVar2 = this->_ref;
  if (pwVar3 != pwVar2) {
    if (pwVar3 == (world *)0x0) {
      pwVar3 = (world *)0x0;
    }
    else {
      iVar1 = (*(pwVar3->super_metatype).super_convertable._vptr_convertable[2])(pwVar3);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        pwVar3 = (world *)0x0;
      }
      pwVar2 = this->_ref;
    }
    if (pwVar2 != (world *)0x0) {
      (*(pwVar2->super_metatype).super_convertable._vptr_convertable[1])();
    }
    this->_ref = pwVar3;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}